

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_server.c
# Opt level: O2

void mk_server_launch_workers(mk_server *server)

{
  int iVar1;
  pthread_t skip;
  pthread_t local_20;
  
  for (iVar1 = 0; iVar1 < server->workers; iVar1 = iVar1 + 1) {
    mk_sched_launch_thread(server,&local_20);
  }
  return;
}

Assistant:

void mk_server_launch_workers(struct mk_server *server)
{
    int i;
    pthread_t skip;

    /* Launch workers */
    for (i = 0; i < server->workers; i++) {
        /* Spawn the thread */
        mk_sched_launch_thread(server, &skip);
    }
}